

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_interpreter.c
# Opt level: O0

char * read_ld_version(char *path)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  long lVar3;
  char *new_version;
  int itr;
  FILE *fp;
  char version [254];
  char *path_local;
  
  memset(&fp,0,0xfe);
  __stream = fopen(path,"r");
  if (__stream != (FILE *)0x0) {
    while (iVar1 = fgetc(__stream), iVar1 != -1) {
      if ((iVar1 == 0x6c) &&
         (pcVar2 = try_read_ld_version_string((FILE *)__stream), pcVar2 != (char *)0x0)) {
        lVar3 = compare_version_strings(pcVar2,(char *)&fp);
        if (0 < lVar3) {
          strcpy((char *)&fp,pcVar2);
        }
        free(pcVar2);
      }
    }
    fclose(__stream);
  }
  pcVar2 = strdup((char *)&fp);
  return pcVar2;
}

Assistant:

char *read_ld_version(char *path) {
    char version[254] = {0x0};
    FILE *fp = fopen(path, "r");
    if (fp) {
        int itr;
        while ((itr = fgetc(fp)) != EOF) {
            if (itr == 'l') {
                char *new_version = try_read_ld_version_string(fp);
                if (new_version != NULL) {
                    if (compare_version_strings(new_version, version) > 0)
                        strcpy(version, new_version);

                    free(new_version);
                }
            }
        }

        fclose(fp);
    }

    return strdup(version);
}